

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

bool __thiscall
dap::BasicTypeInfo<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_>::serialize
          (BasicTypeInfo<std::vector<dap::Variable,_std::allocator<dap::Variable>_>_> *this,
          Serializer *s,void *ptr)

{
  int iVar1;
  const_iterator it;
  long *local_30;
  undefined8 local_28;
  code *local_20;
  code *local_18;
  long local_10;
  
  local_10 = *ptr;
  local_30 = &local_10;
  local_28 = 0;
  local_18 = std::
             _Function_handler<bool_(dap::Serializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:200:28)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<bool_(dap::Serializer_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmcppdap/include/dap/serialization.h:200:28)>
             ::_M_manager;
  iVar1 = (*s->_vptr_Serializer[8])
                    (s,(*(long *)((long)ptr + 8) - local_10 >> 5) * 0x2e8ba2e8ba2e8ba3);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,3);
  }
  return SUB41(iVar1,0);
}

Assistant:

inline bool serialize(Serializer* s, const void* ptr) const override {
    return s->serialize(*reinterpret_cast<const T*>(ptr));
  }